

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O2

boolean jt_read_integer(char **strptr,JDIMENSION *result)

{
  char cVar1;
  char *pcVar2;
  ushort **ppuVar3;
  long lVar4;
  JDIMENSION JVar5;
  
  pcVar2 = *strptr;
  ppuVar3 = __ctype_b_loc();
  lVar4 = 0;
  JVar5 = 0;
  while (cVar1 = pcVar2[lVar4], (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) != 0) {
    JVar5 = (JVar5 * 10 + (int)cVar1) - 0x30;
    lVar4 = lVar4 + 1;
  }
  *result = JVar5;
  if (lVar4 != 0) {
    *strptr = pcVar2 + lVar4;
  }
  return (uint)(lVar4 != 0);
}

Assistant:

LOCAL(boolean)
jt_read_integer(const char **strptr, JDIMENSION *result)
{
  const char *ptr = *strptr;
  JDIMENSION val = 0;

  for (; isdigit(*ptr); ptr++) {
    val = val * 10 + (JDIMENSION)(*ptr - '0');
  }
  *result = val;
  if (ptr == *strptr)
    return FALSE;               /* oops, no digits */
  *strptr = ptr;
  return TRUE;
}